

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O2

int lj_cf_table_maxn(lua_State *L)

{
  ulong uVar1;
  long lVar2;
  GCtab *pGVar3;
  ulong uVar4;
  uint *puVar5;
  double dVar6;
  double dVar7;
  
  pGVar3 = lj_lib_checktab(L,1);
  uVar4 = (ulong)pGVar3->asize;
  do {
    if ((long)uVar4 < 1) {
      dVar6 = 0.0;
      goto LAB_0013e6b4;
    }
    uVar1 = uVar4 - 1;
    lVar2 = uVar4 * 8;
    uVar4 = uVar1;
  } while (*(int *)(((ulong)(pGVar3->array).ptr32 - 4) + lVar2) == -1);
  dVar6 = (double)(int)uVar1;
LAB_0013e6b4:
  uVar4 = (ulong)pGVar3->hmask;
  puVar5 = (uint *)((ulong)(pGVar3->node).ptr32 + uVar4 * 0x18 + 0xc);
  for (; -1 < (long)uVar4; uVar4 = uVar4 - 1) {
    dVar7 = dVar6;
    if (((puVar5[-2] != 0xffffffff) && (*puVar5 < 0xffff0000)) &&
       (dVar7 = *(double *)(puVar5 + -1), *(double *)(puVar5 + -1) <= dVar6)) {
      dVar7 = dVar6;
    }
    puVar5 = puVar5 + -6;
    dVar6 = dVar7;
  }
  L->top[-1].n = dVar6;
  return 1;
}

Assistant:

LJLIB_CF(table_maxn)
{
  GCtab *t = lj_lib_checktab(L, 1);
  TValue *array = tvref(t->array);
  Node *node;
  lua_Number m = 0;
  ptrdiff_t i;
  for (i = (ptrdiff_t)t->asize - 1; i >= 0; i--)
    if (!tvisnil(&array[i])) {
      m = (lua_Number)(int32_t)i;
      break;
    }
  node = noderef(t->node);
  for (i = (ptrdiff_t)t->hmask; i >= 0; i--)
    if (!tvisnil(&node[i].val) && tvisnumber(&node[i].key)) {
      lua_Number n = numberVnum(&node[i].key);
      if (n > m) m = n;
    }
  setnumV(L->top-1, m);
  return 1;
}